

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

void __thiscall
Js::ArrayBuffer::ArrayBuffer
          (ArrayBuffer *this,RefCountedBuffer *buffContent,uint32 length,DynamicType *type)

{
  bool bVar1;
  ScriptContext *pSVar2;
  Recycler *this_00;
  DynamicType *type_local;
  uint32 length_local;
  RefCountedBuffer *buffContent_local;
  ArrayBuffer *this_local;
  
  ArrayBufferBase::ArrayBufferBase(&this->super_ArrayBufferBase,type);
  (this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01dfa988;
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ArrayBufferParent>_>::WriteBarrierPtr
            (&this->primaryParent);
  Memory::WriteBarrierPtr<Js::ArrayBuffer::OtherParents>::WriteBarrierPtr(&this->otherParents);
  this->bufferContent = (Type)0x0;
  this->bufferLength = length;
  if (0x7fffffff < length) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec37,(PCWSTR)0x0);
  }
  this_00 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  bVar1 = Memory::Recycler::RequestExternalMemoryAllocation(this_00,(ulong)length);
  if (!bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowOutOfMemoryError(pSVar2);
  }
  this->bufferContent = buffContent;
  if (this->bufferContent != (Type)0x0) {
    RefCountedBuffer::AddRef(this->bufferContent);
  }
  return;
}

Assistant:

ArrayBuffer::ArrayBuffer(RefCountedBuffer* buffContent, uint32 length, DynamicType * type)
       : bufferContent(nullptr), bufferLength(length), ArrayBufferBase(type)
    {
        if (length > MaxArrayBufferLength)
        {
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_FunctionArgument_Invalid);
        }

        // we take the ownership of the buffer and will have to free it so charge it to our quota.
        if (!this->GetRecycler()->RequestExternalMemoryAllocation(length))
        {
            JavascriptError::ThrowOutOfMemoryError(this->GetScriptContext());
        }

        this->bufferContent = buffContent;

        // The bufferContent can be null as might have detached an ArrayBuffer which does not have bufferContent.
        if (this->bufferContent != nullptr)
        {
            this->bufferContent->AddRef();
        }
    }